

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Singleton.h
# Opt level: O0

void __thiscall
axl::sl::ConstructSingleton<axl::err::ErrorMgr>::operator()
          (ConstructSingleton<axl::err::ErrorMgr> *this,void *p)

{
  Module *this_00;
  ErrorMgr *p_00;
  Module *in_RSI;
  ErrorMgr *unaff_retaddr;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffd0;
  Ptr<axl::g::Finalizer> *in_stack_ffffffffffffffe8;
  
  err::ErrorMgr::ErrorMgr(unaff_retaddr);
  this_00 = g::getModule();
  p_00 = (ErrorMgr *)mem::allocate(0x10835c);
  DestructSingleton<axl::err::ErrorMgr>::DestructSingleton
            ((DestructSingleton<axl::err::ErrorMgr> *)this_00,p_00);
  rc::primeRefCount<axl::sl::DestructSingleton<axl::err::ErrorMgr>>
            ((DestructSingleton<axl::err::ErrorMgr> *)this_00,(FreeFunc *)p_00);
  rc::Ptr<axl::g::Finalizer>::Ptr<axl::sl::DestructSingleton<axl::err::ErrorMgr>>
            (in_stack_ffffffffffffffd0,
             (DestructSingleton<axl::err::ErrorMgr> *)&stack0xffffffffffffffe0);
  g::Module::addFinalizer(in_RSI,in_stack_ffffffffffffffe8);
  rc::Ptr<axl::g::Finalizer>::~Ptr((Ptr<axl::g::Finalizer> *)0x1083aa);
  return;
}

Assistant:

void
	operator () (void* p) {
		new(p)T;
		g::getModule()->addFinalizer(AXL_RC_NEW_ARGS(Destruct, ((T*)p)));
	}